

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::concat<char[3]>(path *this,char (*x) [3])

{
  size_t sVar1;
  path p;
  path local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  sVar1 = strlen(*x);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,x,*x + sVar1);
  local_60._path._M_dataplus._M_p = (pointer)&local_60._path.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_60,local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  postprocess_path_with_format(&local_60,auto_format);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_60._path._M_dataplus._M_p);
  postprocess_path_with_format(this,native_format);
  ~path(&local_60);
  return this;
}

Assistant:

inline path& path::concat(const Source& x)
{
    path p(x);
    _path += p._path;
    postprocess_path_with_format(native_format);
    return *this;
}